

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

ssize_t __thiscall jessilib::config::write(config *this,int __fd,void *__buf,size_t __n)

{
  path *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  string sStack_48;
  
  impl::_assert_helper
            ((((path *)CONCAT44(in_register_00000034,__fd))->_M_pathname)._M_string_length != 0,
             "Failed assertion: \'!in_filename.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:102"
            );
  std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)this);
  this_00 = &this->m_filename;
  std::filesystem::__cxx11::path::operator=(this_00,(path *)CONCAT44(in_register_00000034,__fd));
  get_format(&sStack_48,this_00,(string *)__buf);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_format,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  this->m_encoding = (text_encoding)__n;
  write_object(&this->m_data,this_00,&this->m_format,(text_encoding)__n);
  iVar1 = pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void config::write(const std::filesystem::path& in_filename , const std::string& in_format, text_encoding in_encoding) {
	jessilib_assert(!in_filename.empty());
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	// Setup
	m_filename = in_filename;
	m_format = get_format(m_filename, in_format);
	m_encoding = in_encoding;

	// Write
	write_object(m_data, m_filename, m_format, m_encoding);
}